

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_214010::CAPIBuildSystemFrontendDelegate::hadCommandFailure
          (CAPIBuildSystemFrontendDelegate *this)

{
  _func_void_void_ptr *UNRECOVERED_JUMPTABLE;
  
  llbuild::buildsystem::BuildSystemFrontendDelegate::hadCommandFailure
            (&this->super_BuildSystemFrontendDelegate);
  UNRECOVERED_JUMPTABLE = (this->cAPIDelegate).had_command_failure;
  if (UNRECOVERED_JUMPTABLE != (_func_void_void_ptr *)0x0) {
    (*UNRECOVERED_JUMPTABLE)((this->cAPIDelegate).context);
    return;
  }
  (*(this->super_BuildSystemFrontendDelegate).super_BuildSystemDelegate._vptr_BuildSystemDelegate
    [0x14])(this);
  return;
}

Assistant:

virtual void hadCommandFailure() override {
    // Call the base implementation.
    BuildSystemFrontendDelegate::hadCommandFailure();

    // Report the command failure, if the client provided an appropriate
    // callback.
    if (cAPIDelegate.had_command_failure) {
      cAPIDelegate.had_command_failure(cAPIDelegate.context);
    } else {
      // Otherwise, the default behavior is to immediately cancel.
      cancel();
    }
  }